

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::HasNonBuiltInCallee(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicProfileInfo *this_00;
  ProfileId callSiteId;
  
  if (this->profiledCallSiteCount == 0) {
    bVar2 = false;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    callSiteId = 0;
    do {
      this_00 = (this->dynamicProfileInfo).ptr;
      if (this_00 == (DynamicProfileInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1e9d,"(HasDynamicProfileInfo())","HasDynamicProfileInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        this_00 = (this->dynamicProfileInfo).ptr;
      }
      bVar2 = DynamicProfileInfo::MayHaveNonBuiltinCallee(this_00,callSiteId);
    } while ((!bVar2) && (callSiteId = callSiteId + 1, callSiteId < this->profiledCallSiteCount));
  }
  return bVar2;
}

Assistant:

bool FunctionBody::HasNonBuiltInCallee()
    {
        for (ProfileId i = 0; i < profiledCallSiteCount; i++)
        {
            Assert(HasDynamicProfileInfo());
            if (dynamicProfileInfo->MayHaveNonBuiltinCallee(i))
            {
                return true;
            }
        }
        return false;
    }